

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::append_name(path *this,char *name)

{
  ulong uVar1;
  char *pcVar2;
  path local_38;
  char *local_18;
  char *name_local;
  path *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != '/') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::operator+=((string *)this,local_18);
  }
  else {
    path<char_const*,ghc::filesystem::path>(&local_38,&local_18,auto_format);
    operator/=(this,&local_38);
    ~path(&local_38);
  }
  return;
}

Assistant:

GHC_INLINE void path::append_name(const char* name)
{
    if (_path.empty()) {
        this->operator/=(path(name));
    }
    else {
        if (_path.back() != path::generic_separator) {
            _path.push_back(path::generic_separator);
        }
        _path += name;
    }
}